

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O2

void extendText(cmGeneratorExpressionEvaluatorVector *result,const_iterator it)

{
  cmGeneratorExpressionEvaluator *pcVar1;
  pointer puVar2;
  int iVar3;
  pointer *__ptr;
  _Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false> local_28;
  cmGeneratorExpressionEvaluator *local_20;
  
  puVar2 = (result->
           super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((result->
       super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start != puVar2) &&
     (iVar3 = (*(puVar2[-1]._M_t.
                 super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl)->
                _vptr_cmGeneratorExpressionEvaluator[2])(), iVar3 == 0)) {
    pcVar1 = (result->
             super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
             .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl + 2;
    pcVar1->_vptr_cmGeneratorExpressionEvaluator =
         (_func_int **)
         ((long)pcVar1->_vptr_cmGeneratorExpressionEvaluator + (it._M_current)->Length);
    return;
  }
  std::make_unique<TextContent,char_const*const&,unsigned_long_const&>
            ((char **)&local_20,(unsigned_long *)&(it._M_current)->Content);
  local_28._M_head_impl = local_20;
  local_20 = (cmGeneratorExpressionEvaluator *)0x0;
  std::
  vector<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>,std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>>
  ::
  emplace_back<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>
            ((vector<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>,std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>>
              *)result,
             (unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
              *)&local_28);
  if (local_28._M_head_impl != (cmGeneratorExpressionEvaluator *)0x0) {
    (*(local_28._M_head_impl)->_vptr_cmGeneratorExpressionEvaluator[1])();
  }
  if (local_20 != (cmGeneratorExpressionEvaluator *)0x0) {
    (*local_20->_vptr_cmGeneratorExpressionEvaluator[1])();
  }
  return;
}

Assistant:

static void extendText(
  cmGeneratorExpressionEvaluatorVector& result,
  std::vector<cmGeneratorExpressionToken>::const_iterator it)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text) {
    cm::static_reference_cast<TextContent>(*(result.end() - 1))
      .Extend(it->Length);
  } else {
    auto textContent = cm::make_unique<TextContent>(it->Content, it->Length);
    result.push_back(std::move(textContent));
  }
}